

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::ServiceGenerator::GenerateStubMethods
          (ServiceGenerator *this,Printer *printer)

{
  ushort *puVar1;
  ServiceDescriptor *pSVar2;
  Descriptor *pDVar3;
  Nonnull<char_*> pcVar4;
  long lVar5;
  MethodDescriptor *pMVar6;
  long lVar7;
  anon_class_1_0_00000001 local_451;
  Sub *local_450;
  Sub *local_448;
  Options *local_440;
  string local_438;
  string local_418;
  string local_3f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d8;
  undefined1 local_3b8 [32];
  Printer *local_398;
  string local_390;
  undefined1 local_370 [32];
  basic_string_view<char,_std::char_traits<char>_> local_350;
  long local_340;
  Nonnull<char_*> local_338;
  char local_330 [24];
  char acStack_318 [8];
  Sub local_310;
  Sub local_258;
  Sub local_1a0;
  Sub local_e8;
  
  pSVar2 = this->descriptor_;
  if (0 < pSVar2->method_count_) {
    local_448 = &local_258;
    local_450 = &local_1a0;
    lVar5 = 0;
    local_440 = (Options *)this;
    local_398 = printer;
    do {
      pMVar6 = pSVar2->methods_;
      local_3b8._0_8_ = local_3b8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_3b8,"name","");
      puVar1 = (ushort *)pMVar6[lVar5].all_names_.payload_;
      local_350._M_len = (size_t)*puVar1;
      local_350._M_str = (char *)((long)puVar1 + ~local_350._M_len);
      io::Printer::Sub::Sub<std::basic_string_view<char,std::char_traits<char>>>
                (&local_310,(string *)local_3b8,&local_350);
      local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f8,"input","");
      pMVar6 = pMVar6 + lVar5;
      pDVar3 = MethodDescriptor::input_type(pMVar6);
      QualifiedClassName_abi_cxx11_
                ((string *)local_370,(cpp *)pDVar3,(Descriptor *)local_440->split_map,local_440);
      io::Printer::Sub::Sub<std::__cxx11::string>(&local_258,&local_3f8,(string *)local_370);
      local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_418,"output","");
      pDVar3 = MethodDescriptor::output_type(pMVar6);
      QualifiedClassName_abi_cxx11_
                (&local_390,(cpp *)pDVar3,(Descriptor *)local_440->split_map,local_440);
      io::Printer::Sub::Sub<std::__cxx11::string>(&local_1a0,&local_418,&local_390);
      local_438._M_dataplus._M_p = (pointer)&local_438.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_438,"index","");
      pcVar4 = absl::lts_20250127::numbers_internal::FastIntToBuffer((int32_t)lVar5,local_330);
      local_340 = (long)pcVar4 - (long)local_330;
      local_3d8._M_dataplus._M_p = (pointer)&local_3d8.field_2;
      local_338 = local_330;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d8,local_330,pcVar4);
      io::Printer::Sub::Sub<std::__cxx11::string>(&local_e8,&local_438,&local_3d8);
      io::Printer::Emit(local_398,&local_310,4,0x18b,
                        "\n          void $classname$_Stub::$name$(\n              $pb$::RpcController* $nullable$ controller,\n              const $input$* $nonnull$ request, $output$* $nonnull$ response,\n              ::google::protobuf::Closure* $nullable$ done) {\n            channel_->CallMethod(descriptor()->method($index$), controller,\n                                 request, response, done);\n          }\n        "
                       );
      lVar7 = 0x2e0;
      do {
        if (acStack_318[lVar7] == '\x01') {
          std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
                    ((_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord> *)
                     (local_370 + lVar7 + 0x18));
        }
        if ((long *)(local_370 + lVar7) != *(long **)(local_370 + lVar7 + -0x10)) {
          operator_delete(*(long **)(local_370 + lVar7 + -0x10),*(long *)(local_370 + lVar7) + 1);
        }
        (*std::__detail::__variant::
          __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
          ::_S_vtable._M_arr[(byte)local_370[lVar7 + -0x18]]._M_data)
                  (&local_451,
                   (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                    *)(local_3b8 + lVar7 + 0x10));
        local_370[lVar7 + -0x18] = 0xff;
        if ((long *)(local_3b8 + lVar7) != *(long **)(local_3b8 + lVar7 + -0x10)) {
          operator_delete(*(long **)(local_3b8 + lVar7 + -0x10),*(long *)(local_3b8 + lVar7) + 1);
        }
        lVar7 = lVar7 + -0xb8;
      } while (lVar7 != 0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
        operator_delete(local_3d8._M_dataplus._M_p,local_3d8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_438._M_dataplus._M_p != &local_438.field_2) {
        operator_delete(local_438._M_dataplus._M_p,local_438.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_390._M_dataplus._M_p != &local_390.field_2) {
        operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_418._M_dataplus._M_p != &local_418.field_2) {
        operator_delete(local_418._M_dataplus._M_p,local_418.field_2._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_370._0_8_ != local_370 + 0x10) {
        operator_delete((void *)local_370._0_8_,local_370._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
        operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_3b8._0_8_ != local_3b8 + 0x10) {
        operator_delete((void *)local_3b8._0_8_,local_3b8._16_8_ + 1);
      }
      lVar5 = lVar5 + 1;
      pSVar2 = (ServiceDescriptor *)local_440->access_info_map;
    } while (lVar5 < pSVar2->method_count_);
  }
  return;
}

Assistant:

void ServiceGenerator::GenerateStubMethods(io::Printer* printer) {
  for (int i = 0; i < descriptor_->method_count(); ++i) {
    const MethodDescriptor* method = descriptor_->method(i);

    printer->Emit(
        {
            {"name", method->name()},
            {"input", QualifiedClassName(method->input_type(), *options_)},
            {"output", QualifiedClassName(method->output_type(), *options_)},
            {"index", absl::StrCat(i)},
        },
        R"cc(
          void $classname$_Stub::$name$(
              $pb$::RpcController* $nullable$ controller,
              const $input$* $nonnull$ request, $output$* $nonnull$ response,
              ::google::protobuf::Closure* $nullable$ done) {
            channel_->CallMethod(descriptor()->method($index$), controller,
                                 request, response, done);
          }
        )cc");
  }
}